

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3HexToBlob(sqlite3 *db,char *z,int n)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  
  pbVar1 = (byte *)sqlite3DbMallocRawNN(db,(ulong)(n / 2 + 1));
  if (pbVar1 != (byte *)0x0) {
    pbVar3 = pbVar1;
    for (lVar2 = 0; lVar2 < n + -1; lVar2 = lVar2 + 2) {
      *pbVar3 = ((char)(z[lVar2 + 1] * '\x02') >> 7 & 9U) + z[lVar2 + 1] & 0xf |
                (((char)(z[lVar2] * '\x02') >> 7 & 9U) + z[lVar2]) * '\x10';
      pbVar3 = pbVar3 + 1;
    }
    *pbVar3 = 0;
  }
  return pbVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HexToBlob(sqlite3 *db, const char *z, int n){
  char *zBlob;
  int i;

  zBlob = (char *)sqlite3DbMallocRawNN(db, n/2 + 1);
  n--;
  if( zBlob ){
    for(i=0; i<n; i+=2){
      zBlob[i/2] = (sqlite3HexToInt(z[i])<<4) | sqlite3HexToInt(z[i+1]);
    }
    zBlob[i/2] = 0;
  }
  return zBlob;
}